

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O0

SumNum __thiscall
Instance::sumnumprimalinfeasibilities(Instance *this,QpVector *x,QpVector *rowactivity)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SumNum SVar4;
  HighsInt var;
  HighsInt row;
  SumNum res;
  int local_30;
  int local_2c;
  SumNum local_10;
  
  SumNum::SumNum(&local_10);
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 8); local_2c = local_2c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)local_2c);
    dVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_2c);
    if (*pvVar3 <= dVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)local_2c)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),(long)local_2c
                         );
      if (*pvVar3 <= dVar1 && dVar1 != *pvVar3) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),
                            (long)local_2c);
        dVar1 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),
                            (long)local_2c);
        local_10.sum = (dVar1 - *pvVar3) + local_10.sum;
        local_10.num = local_10.num + 1;
      }
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_2c)
      ;
      dVar1 = *pvVar3;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)local_2c)
      ;
      local_10.sum = (dVar1 - *pvVar2) + local_10.sum;
      local_10.num = local_10.num + 1;
    }
  }
  for (local_30 = 0; local_30 < *(int *)(in_RDI + 4); local_30 = local_30 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_30);
    dVar1 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1d0),(long)local_30);
    if (*pvVar3 <= dVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_30)
      ;
      dVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),(long)local_30
                         );
      if (*pvVar3 <= dVar1 && dVar1 != *pvVar3) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_30);
        dVar1 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e8),
                            (long)local_30);
        local_10.sum = (dVar1 - *pvVar3) + local_10.sum;
        local_10.num = local_10.num + 1;
      }
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1d0),(long)local_30
                         );
      dVar1 = *pvVar3;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_30)
      ;
      local_10.sum = (dVar1 - *pvVar2) + local_10.sum;
      local_10.num = local_10.num + 1;
    }
  }
  SVar4.num = local_10.num;
  SVar4.sum = local_10.sum;
  SVar4._12_4_ = 0;
  return SVar4;
}

Assistant:

SumNum sumnumprimalinfeasibilities(const QpVector& x,
                                     const QpVector& rowactivity) {
    SumNum res;
    for (HighsInt row = 0; row < num_con; row++) {
      if (rowactivity.value[row] < con_lo[row]) {
        res.sum += (con_lo[row] - rowactivity.value[row]);
        res.num++;
      } else if (rowactivity.value[row] > con_up[row]) {
        res.sum += (rowactivity.value[row] - con_up[row]);
        res.num++;
      }
    }
    for (HighsInt var = 0; var < num_var; var++) {
      if (x.value[var] < var_lo[var]) {
        res.sum += (var_lo[var] - x.value[var]);
        res.num++;
      } else if (x.value[var] > var_up[var]) {
        res.sum += (x.value[var] - var_up[var]);
        res.num++;
      }
    }
    return res;
  }